

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer.cpp
# Opt level: O0

Layer * ncnn::create_layer(int index)

{
  Layer *pLVar1;
  int in_EDI;
  Layer_final *layer_final;
  Layer *layer_cpu;
  Layer_final *in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffdc;
  Layer_final *local_8;
  
  pLVar1 = create_layer_cpu(in_stack_ffffffffffffffdc);
  if (pLVar1 == (Layer *)0x0) {
    local_8 = (Layer_final *)0x0;
  }
  else {
    local_8 = (Layer_final *)operator_new(0xd8);
    Layer_final::Layer_final(in_stack_ffffffffffffffd0);
    local_8->layer_cpu = pLVar1;
    (local_8->super_Layer).typeindex = in_EDI;
    Layer_final::set_layer_properties(in_stack_ffffffffffffffd0);
    Layer_final::get_layer_properties(local_8);
  }
  return &local_8->super_Layer;
}

Assistant:

Layer* create_layer(int index)
{
    Layer* layer_cpu = create_layer_cpu(index);
    if (!layer_cpu)
        return 0;

    Layer_final* layer_final = new Layer_final;
    layer_final->layer_cpu = layer_cpu;

#if NCNN_VULKAN
    layer_final->layer_vulkan = create_layer_vulkan(index);
#endif

    layer_final->typeindex = index;
    layer_final->set_layer_properties();
    layer_final->get_layer_properties();

    return layer_final;
}